

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  pointer pbVar5;
  pointer puVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  string *psVar10;
  long *plVar11;
  long lVar12;
  _Rb_tree_node_base *p_Var13;
  size_type *psVar14;
  string *listFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  pointer puVar15;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lgen;
  cmExtraKateGenerator *pcVar16;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string s;
  string mode;
  long *local_118 [2];
  long local_108 [2];
  cmExtraKateGenerator *local_f8;
  path local_f0;
  undefined1 local_c8 [32];
  _List local_a8;
  size_t local_a0;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = lg->Makefile;
  local_c8._0_8_ = local_c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CMAKE_KATE_FILES_MODE","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_c8);
  cmsys::SystemTools::UpperCase(&local_78,psVar10);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   gitString_abi_cxx11_), iVar9 != 0)) {
    GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_,
               "\"git\": 1 ","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         gitString_abi_cxx11_);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   svnString_abi_cxx11_), iVar9 != 0)) {
    GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_,
               "\"svn\": 1 ","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         svnString_abi_cxx11_);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   hgString_abi_cxx11_), iVar9 != 0)) {
    GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_,
               "\"hg\": 1 ","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         hgString_abi_cxx11_);
  }
  if ((GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                                   fossilString_abi_cxx11_), iVar9 != 0)) {
    GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                     fossilString_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_,
               "\"fossil\": 1 ","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         fossilString_abi_cxx11_);
  }
  iVar9 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar9 == 0) {
    psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::svnString_abi_cxx11_;
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar9 == 0) {
      psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::gitString_abi_cxx11_;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar9 == 0) {
        psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::hgString_abi_cxx11_;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar9 != 0) {
          iVar9 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar9 != 0) {
            psVar10 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
            pcVar3 = (psVar10->_M_dataplus)._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar3,pcVar3 + psVar10->_M_string_length);
            cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                      ((cmCMakePath *)local_c8,&local_50,auto_format);
            local_f8 = this;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            paVar1 = &local_f0._M_pathname.field_2;
            do {
              local_f0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,local_c8._0_8_,
                         (pointer)(local_c8._0_8_ + CONCAT44(local_c8._12_4_,local_c8._8_4_)));
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              psVar14 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_98.field_2._M_allocated_capacity = *psVar14;
                local_98.field_2._8_8_ = plVar11[3];
              }
              else {
                local_98.field_2._M_allocated_capacity = *psVar14;
                local_98._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_98._M_string_length = plVar11[1];
              *plVar11 = (long)psVar14;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_pathname._M_dataplus._M_p != paVar1) {
                operator_delete(local_f0._M_pathname._M_dataplus._M_p,
                                local_f0._M_pathname.field_2._M_allocated_capacity + 1);
              }
              bVar7 = cmsys::SystemTools::FileExists(&local_98);
              psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                         gitString_abi_cxx11_;
              if (bVar7) {
LAB_00524be9:
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                pcVar3 = (psVar10->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)__return_storage_ptr__,pcVar3,
                           pcVar3 + psVar10->_M_string_length);
                iVar9 = 1;
LAB_00524c05:
                bVar7 = false;
              }
              else {
                local_118[0] = local_108;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_118,local_c8._0_8_,
                           (pointer)(local_c8._0_8_ + CONCAT44(local_c8._12_4_,local_c8._8_4_)));
                plVar11 = (long *)std::__cxx11::string::append((char *)local_118);
                psVar14 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_f0._M_pathname.field_2._M_allocated_capacity = *psVar14;
                  local_f0._M_pathname.field_2._8_8_ = plVar11[3];
                  local_f0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_f0._M_pathname.field_2._M_allocated_capacity = *psVar14;
                  local_f0._M_pathname._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_f0._M_pathname._M_string_length = plVar11[1];
                *plVar11 = (long)psVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_98,(string *)&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_pathname._M_dataplus._M_p != paVar1) {
                  operator_delete(local_f0._M_pathname._M_dataplus._M_p,
                                  local_f0._M_pathname.field_2._M_allocated_capacity + 1);
                }
                if (local_118[0] != local_108) {
                  operator_delete(local_118[0],local_108[0] + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_98);
                psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           svnString_abi_cxx11_;
                if (bVar7) goto LAB_00524be9;
                local_118[0] = local_108;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_118,local_c8._0_8_,
                           (pointer)(local_c8._0_8_ + CONCAT44(local_c8._12_4_,local_c8._8_4_)));
                plVar11 = (long *)std::__cxx11::string::append((char *)local_118);
                psVar14 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_f0._M_pathname.field_2._M_allocated_capacity = *psVar14;
                  local_f0._M_pathname.field_2._8_8_ = plVar11[3];
                  local_f0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_f0._M_pathname.field_2._M_allocated_capacity = *psVar14;
                  local_f0._M_pathname._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_f0._M_pathname._M_string_length = plVar11[1];
                *plVar11 = (long)psVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_98,(string *)&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_pathname._M_dataplus._M_p != paVar1) {
                  operator_delete(local_f0._M_pathname._M_dataplus._M_p,
                                  local_f0._M_pathname.field_2._M_allocated_capacity + 1);
                }
                if (local_118[0] != local_108) {
                  operator_delete(local_118[0],local_108[0] + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_98);
                psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           hgString_abi_cxx11_;
                if (bVar7) goto LAB_00524be9;
                local_118[0] = local_108;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_118,local_c8._0_8_,
                           (pointer)(local_c8._0_8_ + CONCAT44(local_c8._12_4_,local_c8._8_4_)));
                plVar11 = (long *)std::__cxx11::string::append((char *)local_118);
                psVar14 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_f0._M_pathname.field_2._M_allocated_capacity = *psVar14;
                  local_f0._M_pathname.field_2._8_8_ = plVar11[3];
                  local_f0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_f0._M_pathname.field_2._M_allocated_capacity = *psVar14;
                  local_f0._M_pathname._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_f0._M_pathname._M_string_length = plVar11[1];
                *plVar11 = (long)psVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_98,(string *)&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_pathname._M_dataplus._M_p != paVar1) {
                  operator_delete(local_f0._M_pathname._M_dataplus._M_p,
                                  local_f0._M_pathname.field_2._M_allocated_capacity + 1);
                }
                if (local_118[0] != local_108) {
                  operator_delete(local_118[0],local_108[0] + 1);
                }
                bVar7 = cmsys::SystemTools::FileExists(&local_98);
                psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::
                           fossilString_abi_cxx11_;
                if (bVar7) goto LAB_00524be9;
                cVar8 = std::filesystem::__cxx11::path::has_relative_path();
                if (cVar8 == '\0') {
                  iVar9 = 2;
                  goto LAB_00524c05;
                }
                cmCMakePath::GetParentPath((cmCMakePath *)&local_f0,(cmCMakePath *)local_c8);
                cmCMakePath::operator=((cmCMakePath *)local_c8,(cmCMakePath *)&local_f0);
                std::filesystem::__cxx11::path::~path(&local_f0);
                iVar9 = 0;
                bVar7 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
            } while (iVar9 == 0);
            if (iVar9 == 2) {
              std::filesystem::__cxx11::path::~path((path *)local_c8);
              this = local_f8;
            }
            else {
              std::filesystem::__cxx11::path::~path((path *)local_c8);
              this = local_f8;
              if (!bVar7) goto LAB_00524ccb;
            }
          }
          local_c8._24_8_ = (long)local_c8 + 8;
          local_c8._8_4_ = _S_red;
          local_c8._16_8_ = 0;
          local_a0 = 0;
          local_58 = &__return_storage_ptr__->field_2;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          pcVar4 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
          pcVar16 = (cmExtraKateGenerator *)
                    (pcVar4->LocalGenerators).
                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_f8 = (cmExtraKateGenerator *)
                     (pcVar4->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          local_a8._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
               = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    )local_c8._24_8_;
          if (pcVar16 != local_f8) {
            do {
              pcVar2 = ((((__uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                           *)&(pcVar16->super_cmExternalMakefileProjectGenerator).
                              _vptr_cmExternalMakefileProjectGenerator)->_M_t).
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
              pbVar5 = *(pointer *)
                        ((long)&(pcVar2->ListFiles).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        + 8);
              for (__v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          &(pcVar2->ListFiles).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl; __v != pbVar5; __v = __v + 1) {
                lVar12 = std::__cxx11::string::find((char *)__v,0x8e4da1,0);
                if (lVar12 == -1) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_c8,__v);
                }
              }
              puVar6 = *(pointer *)
                        ((long)&(pcVar2->SourceFiles).
                                super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                        + 8);
              for (puVar15 = *(pointer *)
                              &(pcVar2->SourceFiles).
                               super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                               ._M_impl; puVar15 != puVar6; puVar15 = puVar15 + 1) {
                bVar7 = cmSourceFile::GetIsGenerated
                                  ((cmSourceFile *)
                                   (puVar15->_M_t).
                                   super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                   ,GlobalAndLocal);
                if (!bVar7) {
                  cmSourceFile::ResolveFullPath
                            ((cmSourceFile *)
                             (puVar15->_M_t).
                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                             ,(string *)0x0,(string *)0x0);
                  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_c8,__return_storage_ptr__);
                }
              }
              pcVar16 = (cmExtraKateGenerator *)
                        &(pcVar16->super_cmExternalMakefileProjectGenerator).
                         SupportedGlobalGenerators;
            } while (pcVar16 != local_f8);
          }
          std::__cxx11::string::_M_replace
                    ((ulong)__return_storage_ptr__,0,
                     (char *)__return_storage_ptr__->_M_string_length,0x8e5327);
          p_Var13 = (_Rb_tree_node_base *)local_c8._24_8_;
          if ((_Rb_tree_node_base *)local_c8._24_8_ != (_Rb_tree_node_base *)(local_c8 + 8)) {
            do {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,*(ulong *)(p_Var13 + 1));
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
            } while (p_Var13 != (_Rb_tree_node_base *)(local_c8 + 8));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c8);
          goto LAB_00524ccb;
        }
        psVar10 = &GenerateFilesString[abi:cxx11](cmLocalGenerator_const&)::fossilString_abi_cxx11_;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar10->_M_string_length);
LAB_00524ccb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator& lg) const
{
  const cmMakefile* mf = lg.GetMakefile();
  std::string mode =
    cmSystemTools::UpperCase(mf->GetSafeDefinition("CMAKE_KATE_FILES_MODE"));
  static const std::string gitString = "\"git\": 1 ";
  static const std::string svnString = "\"svn\": 1 ";
  static const std::string hgString = "\"hg\": 1 ";
  static const std::string fossilString = "\"fossil\": 1 ";

  if (mode == "SVN") {
    return svnString;
  }
  if (mode == "GIT") {
    return gitString;
  }
  if (mode == "HG") {
    return hgString;
  }
  if (mode == "FOSSIL") {
    return fossilString;
  }

  // check for the VCS files except when "forced" to "FILES" mode:
  if (mode != "LIST") {
    cmCMakePath startDir(lg.GetSourceDirectory(), cmCMakePath::auto_format);
    // move the directories up to the root directory to see whether we are in
    // a subdir of a svn, git, hg or fossil checkout
    for (;;) {
      std::string s = startDir.String() + "/.git";
      if (cmSystemTools::FileExists(s)) {
        return gitString;
      }

      s = startDir.String() + "/.svn";
      if (cmSystemTools::FileExists(s)) {
        return svnString;
      }

      s = startDir.String() + "/.hg";
      if (cmSystemTools::FileExists(s)) {
        return hgString;
      }
      s = startDir.String() + "/.fslckout";
      if (cmSystemTools::FileExists(s)) {
        return fossilString;
      }

      if (!startDir.HasRelativePath()) { // have we reached the root dir ?
        break;
      }
      startDir = startDir.GetParentPath();
    }
  }

  std::set<std::string> files;
  std::string tmp;
  const auto& lgs = this->GlobalGenerator->GetLocalGenerators();

  for (const auto& lgen : lgs) {
    cmMakefile* makefile = lgen->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::string const& listFile : listFiles) {
      if (listFile.find("/CMakeFiles/") == std::string::npos) {
        files.insert(listFile);
      }
    }

    for (const auto& sf : makefile->GetSourceFiles()) {
      if (sf->GetIsGenerated()) {
        continue;
      }

      tmp = sf->ResolveFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::string const& f : files) {
    tmp += sep;
    tmp += " \"";
    tmp += f;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}